

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_parse_body(http_s *h)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FIOBJ FVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  FIOBJ key;
  FIOBJ hash;
  uint uVar11;
  fiobj_object_vtable_s *pfVar12;
  ulong uVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  long i;
  FIOBJ *pobj;
  char *pcVar19;
  char cVar20;
  http_s *phVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  fio_str_info_s ret_2;
  fio_str_info_s ret_8;
  fio_str_info_s content_type;
  FIOBJ local_150;
  fio_str_info_s local_148;
  uint local_124;
  char *local_120;
  fio_str_info_s local_118;
  http_s *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined4 local_d8;
  undefined4 local_d4;
  size_t local_d0;
  fio_str_info_s local_c8;
  ulong local_a8;
  char *local_a0;
  char *local_98;
  ulong local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  long local_70;
  undefined8 local_68;
  char *local_60;
  ulong local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (h->body == 0) {
    return -1;
  }
  if (http_parse_body::content_type_hash == 0) {
    http_parse_body::content_type_hash = fio_siphash13("content-type",0xc,0x144e87,0x1453b6);
  }
  FVar6 = fiobj_hash_get2(h->headers,http_parse_body::content_type_hash);
  if (FVar6 == 0) {
LAB_0014b6d7:
    local_c8.data = anon_var_dwarf_20f;
    uVar11 = 4;
    goto LAB_0014b6ed;
  }
  if ((FVar6 & 1) == 0) {
    uVar3 = (uint)FVar6;
    uVar11 = 0x28;
    switch(uVar3 & 6) {
    case 0:
switchD_0014b694_caseD_0:
      uVar11 = (uint)*(byte *)(FVar6 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0014b694_caseD_4:
      uVar11 = 0x2a;
      break;
    case 6:
      if ((char)FVar6 == '&') {
        local_c8.data = anon_var_dwarf_21a;
        uVar11 = 5;
      }
      else {
        if ((uVar3 & 0xff) != 0x16) {
          if ((uVar3 & 0xff) == 6) goto LAB_0014b6d7;
          switch(uVar3 & 6) {
          case 0:
            goto switchD_0014b694_caseD_0;
          case 4:
            goto switchD_0014b694_caseD_4;
          case 6:
            uVar11 = uVar3;
          }
          break;
        }
        local_c8.data = anon_var_dwarf_225;
        uVar11 = 4;
      }
LAB_0014b6ed:
      local_c8.capa = 0;
      local_c8.len = (size_t)uVar11;
      goto LAB_0014b799;
    }
    switch(uVar11 & 0xff) {
    case 0x27:
      pfVar12 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      pfVar12 = &FIOBJECT_VTABLE_STRING;
      break;
    case 0x29:
      pfVar12 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      pfVar12 = &FIOBJECT_VTABLE_HASH;
      break;
    case 0x2b:
      pfVar12 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar12 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar12->to_str)(&local_c8,FVar6);
  }
  else {
    fio_ltocstr(&local_c8,(long)FVar6 >> 1);
  }
LAB_0014b799:
  pcVar8 = (char *)local_c8.len;
  iVar5 = -1;
  if (local_c8.len < (char *)0x10) {
    return -1;
  }
  if (((char *)0x20 < local_c8.len) &&
     (iVar4 = strncasecmp("application/x-www-form-urlencoded",local_c8.data,0x21), iVar4 == 0)) {
    if (h->params == 0) {
      FVar6 = fiobj_hash_new();
      h->params = FVar6;
    }
    FVar6 = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = FVar6;
    return 0;
  }
  iVar4 = strncasecmp("application/json",local_c8.data,0x10);
  pcVar19 = local_c8.data;
  if (iVar4 != 0) {
    iVar5 = strncasecmp("multipart/form",local_c8.data,0xe);
    if ((iVar5 == 0) && (pvVar7 = memchr(pcVar19,0x3b,(size_t)pcVar8), pvVar7 != (void *)0x0)) {
      do {
        pcVar16 = (char *)((long)pvVar7 + 1);
        pcVar8 = pcVar19 + ((long)pcVar8 - (long)pcVar16);
        if (pcVar8 != (char *)0x0) {
          do {
            if (*pcVar16 != ' ') goto LAB_0014cc28;
            pcVar16 = pcVar16 + 1;
            pcVar8 = pcVar8 + -1;
          } while (pcVar8 != (char *)0x0);
          pcVar8 = (char *)0x0;
        }
LAB_0014cc28:
        if (pcVar8 < (char *)0xa) break;
        iVar5 = strncasecmp("boundary=",pcVar16,9);
        if (iVar5 == 0) {
          pcVar16 = pcVar16 + 9;
          pcVar8 = pcVar8 + -9;
          pvVar7 = memchr(pcVar16,0x3b,(size_t)pcVar8);
          bVar1 = true;
          if (pvVar7 != (void *)0x0) {
            pcVar8 = (char *)((long)pvVar7 - (long)pcVar16);
          }
          goto LAB_0014b823;
        }
        pvVar7 = memchr(pcVar16,0x3b,(size_t)pcVar8);
        pcVar19 = pcVar16;
        if (pvVar7 == (void *)0x0) break;
      } while( true );
    }
    pcVar16 = (char *)0x0;
    pcVar8 = (char *)0x0;
    bVar1 = false;
LAB_0014b823:
    if (!bVar1) {
      return -1;
    }
    local_60 = pcVar16;
    if (h->params == 0) {
      FVar6 = fiobj_hash_new();
      h->params = FVar6;
    }
    local_50 = pcVar8 + 4;
    local_40 = pcVar8 + 5;
    local_68 = 0;
    local_d4 = 0;
    local_d8 = 0;
    pcVar18 = (char *)0x0;
    local_e0 = (char *)0x0;
    pcVar16 = (char *)0x0;
    local_150 = 0;
    pcVar19 = (char *)0x0;
    pcVar14 = (char *)0x0;
    local_f8 = h;
    local_80 = pcVar8;
LAB_0014b8a1:
    local_88 = pcVar14;
    local_38 = pcVar18;
    if (pcVar19 != (char *)0x0) {
      pcVar22 = pcVar19 + (long)pcVar14;
      local_70 = (long)pcVar18 - (long)pcVar14;
      local_124 = 1;
      local_120 = pcVar16;
      local_f0 = pcVar22;
      local_48 = pcVar19;
LAB_0014b8e3:
      if ((char)local_68 == '\0') {
        pcVar19 = local_48;
        if (((local_50 <= local_48) && (*pcVar14 == '-')) && (pcVar14[1] == '-')) {
          uVar11 = bcmp(pcVar14 + 2,local_60,(size_t)pcVar8);
          pcVar19 = (char *)(ulong)uVar11;
          if (uVar11 == 0) goto LAB_0014c3ff;
        }
        goto switchD_0014cacc_caseD_6;
      }
      sVar15 = (long)pcVar22 - (long)pcVar14;
      pvVar7 = memchr(pcVar14,10,sVar15);
      pcVar19 = pcVar22;
      while (pvVar7 != (void *)0x0) {
        pcVar18 = (char *)((long)pvVar7 + 1);
        pcVar22 = local_f0;
        if ((pcVar19 + -(long)pcVar18 < local_50) ||
           (((*pcVar18 == '-' && (*(char *)((long)pvVar7 + 2) == '-')) &&
            (iVar5 = bcmp((void *)((long)pvVar7 + 3),local_60,(size_t)pcVar8), pcVar22 = local_f0,
            iVar5 == 0)))) goto LAB_0014b9b7;
        pvVar7 = memchr(pcVar18,10,(size_t)(pcVar19 + -(long)pcVar18));
        pcVar19 = local_f0;
      }
      pcVar18 = (char *)0x0;
      pcVar22 = pcVar19;
LAB_0014b9b7:
      pcVar16 = local_120;
      if (pcVar18 == (char *)0x0) {
        if (pcVar22 != pcVar14) {
          if (local_e0 == (char *)0x0) {
            local_e0 = pcVar14 + local_70;
          }
          pcVar16 = local_120 + sVar15;
        }
        bVar1 = false;
        pcVar14 = pcVar22;
      }
      else if (pcVar18 + (long)pcVar8 + 4 < pcVar22) {
        pcVar16 = pcVar18 + (~(ulong)pcVar14 - 1);
        if ((pcVar14 + -1)[(long)(pcVar18 + ~(ulong)pcVar14)] != '\r') {
          pcVar16 = pcVar18 + ~(ulong)pcVar14;
        }
        pcVar19 = pcVar14 + local_70;
        if (local_e0 != (char *)0x0) {
          pcVar19 = local_e0;
        }
        if (pcVar16 == (char *)0x0) {
          pcVar19 = local_e0;
        }
        if (local_150 == 0) {
LAB_0014bb04:
          local_148.data = anon_var_dwarf_20f;
          uVar11 = 4;
          goto LAB_0014bb17;
        }
        if ((local_150 & 1) == 0) {
          uVar11 = (uint)local_150 & 6;
          cVar20 = '(';
          switch(uVar11) {
          case 0:
switchD_0014ba37_caseD_0:
            cVar20 = *(char *)(local_150 & 0xfffffffffffffff8);
            break;
          case 4:
switchD_0014ba37_caseD_4:
            cVar20 = '*';
            break;
          case 6:
            if ((char)local_150 == '&') {
              local_148.data = anon_var_dwarf_21a;
              uVar11 = 5;
            }
            else {
              uVar3 = (uint)local_150 & 0xff;
              if (uVar3 != 0x16) {
                if (uVar3 == 6) goto LAB_0014bb04;
                switch(uVar11) {
                case 0:
                  goto switchD_0014ba37_caseD_0;
                case 4:
                  goto switchD_0014ba37_caseD_4;
                case 6:
                  cVar20 = (char)local_150;
                }
                break;
              }
              local_148.data = anon_var_dwarf_225;
              uVar11 = 4;
            }
LAB_0014bb17:
            local_148.capa = 0;
            local_148.len = (size_t)uVar11;
            goto LAB_0014bbb7;
          }
          pfVar12 = &FIOBJECT_VTABLE_NUMBER;
          switch(cVar20) {
          case '\'':
            pfVar12 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case '(':
            pfVar12 = &FIOBJECT_VTABLE_STRING;
            break;
          case ')':
            pfVar12 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case '*':
            pfVar12 = &FIOBJECT_VTABLE_HASH;
            break;
          case '+':
            pfVar12 = &FIOBJECT_VTABLE_DATA;
          }
          (*pfVar12->to_str)(&local_148,local_150);
        }
        else {
          fio_ltocstr(&local_148,(long)local_150 >> 1);
        }
LAB_0014bbb7:
        phVar21 = local_f8;
        pcVar16 = pcVar16 + (long)local_120;
        if (pcVar16 != (char *)0x0) {
          if (pcVar16 < (char *)0x2a) {
            FVar6 = fiobj_str_new(pcVar19 + (long)local_88,(size_t)pcVar16);
            phVar21 = local_f8;
          }
          else {
            FVar6 = fiobj_data_slice(local_f8->body,(intptr_t)pcVar19,(uintptr_t)pcVar16);
          }
          http_add2hash2(phVar21->params,local_148.data,local_148.len,FVar6,'\0');
          fiobj_free(local_150);
          pcVar19 = (char *)0x0;
          local_150 = 0;
          pcVar22 = local_f0;
        }
        bVar1 = true;
        local_68 = 0;
        local_124 = 0;
        pcVar14 = pcVar18;
        local_e0 = pcVar19;
      }
      else {
        pcVar19 = pcVar18 + -2;
        if (pcVar18[-2] == '\r') {
          pcVar19 = pcVar18 + -3;
        }
        if (pcVar19 != pcVar14) {
          if (local_e0 == (char *)0x0) {
            local_e0 = pcVar14 + local_70;
          }
          pcVar16 = pcVar19 + ((long)local_120 - (long)pcVar14);
        }
        bVar1 = false;
        pcVar14 = pcVar19;
      }
      local_120 = pcVar16;
      if (bVar1) {
LAB_0014c3ff:
        if (pcVar14 < pcVar22) {
          if (((pcVar14 + 2)[(long)pcVar8] == '-') && ((pcVar14 + 3)[(long)pcVar8] == '-')) {
            pcVar19 = pcVar14 + (long)local_40;
            iVar5 = 9;
            pcVar14 = pcVar22;
            if ((pcVar19 <= pcVar22) && (pcVar14 = pcVar19, pcVar19 < pcVar22)) {
              pcVar14 = pcVar19 + (*pcVar19 == '\n');
            }
          }
          else {
            uVar13 = (ulong)((pcVar14 + 3)[(long)pcVar8] == '\n');
            pcVar18 = pcVar14 + (long)pcVar8 + uVar13 + 3;
            local_98 = (char *)0x0;
            local_58 = 0;
            pcVar19 = (char *)0x0;
            uVar17 = 0;
            pcVar16 = (char *)0x0;
            uVar9 = 0;
            sVar10 = 0;
            local_a0 = pcVar14;
            do {
              pcVar8 = local_80;
              local_d0 = sVar10;
              if (((pcVar22 <= pcVar18 + 4) || (*pcVar18 == '\n')) || (pcVar18[1] == '\n')) {
                local_e8 = pcVar19;
                if (local_98 == (char *)0x0) {
                  iVar5 = (uint)(pcVar18 + 4 < pcVar22) * 4 + 2;
                  pcVar14 = local_a0;
                  goto LAB_0014caaa;
                }
                pcVar14 = pcVar18 + 1;
                if (pcVar18[1] == '\n') {
                  pcVar14 = pcVar18 + 2;
                }
                local_a8 = uVar9;
                local_78 = pcVar16;
                pvVar7 = memchr(pcVar14,10,(long)pcVar22 - (long)pcVar14);
                if (pvVar7 != (void *)0x0) goto LAB_0014c863;
                pcVar19 = (char *)0x0;
                goto LAB_0014c944;
              }
              pcVar8 = (char *)memchr(pcVar18,10,(long)pcVar22 - (long)pcVar18);
              if (pcVar8 == (char *)0x0) {
                iVar5 = (uint)(local_124 != 0) * 4 + 2;
                local_124 = (uint)(local_124 != 0);
                pcVar8 = local_80;
                pcVar14 = local_a0;
                pcVar22 = local_f0;
                goto LAB_0014caaa;
              }
              local_e8 = pcVar8;
              local_90 = uVar17;
              if (((long)pcVar8 - (long)pcVar18 < 0x1e) ||
                 (iVar5 = strncasecmp(pcVar18,"content-disposition:",0x14), iVar5 != 0)) {
                sVar10 = local_d0;
                uVar17 = local_90;
                uVar23 = local_58;
                if ((0xe < (long)pcVar8 - (long)pcVar18) &&
                   (iVar5 = strncasecmp(pcVar18,"content-type:",0xd), uVar17 = local_90,
                   uVar23 = local_58, iVar5 == 0)) {
                  pcVar16 = pcVar18 + 0xd;
                  if (pcVar18[0xd] == ' ') {
                    pcVar16 = pcVar18 + 0xe;
                  }
                  sVar15 = (long)local_e8 - (long)pcVar16;
                  pvVar7 = memchr(pcVar16,0x3b,sVar15);
                  uVar23 = local_58;
                  if (pvVar7 == (void *)0x0) {
                    iVar5 = (int)sVar15;
                    uVar13 = 0;
                    uVar9 = (ulong)(iVar5 - (uint)(pcVar16[iVar5 - 1] == '\r'));
                  }
                  else {
                    uVar9 = (ulong)(uint)((int)pvVar7 - (int)pcVar16);
                  }
                }
              }
              else {
                local_a8 = uVar9;
                local_78 = pcVar16;
                pcVar18 = (char *)memchr(pcVar18 + 0x14,0x3b,(long)local_e8 - (long)(pcVar18 + 0x14)
                                        );
                sVar10 = local_d0;
                uVar23 = local_58;
                while (pcVar8 = local_e8, uVar17 = local_90, uVar9 = local_a8, pcVar16 = local_78,
                      pcVar18 != (char *)0x0) {
                  pcVar16 = pcVar18 + 1;
                  if (pcVar18[1] == ' ') {
                    pcVar16 = pcVar18 + 2;
                  }
                  if ((pcVar16 + 6 < local_e8) &&
                     (iVar5 = strncasecmp(pcVar16,"name=",5), iVar5 == 0)) {
                    pcVar14 = pcVar16 + 5;
                    if (pcVar16[5] == '\"') {
                      pcVar14 = pcVar16 + 6;
                    }
                    pcVar18 = (char *)memchr(pcVar14,0x3b,(long)pcVar8 - (long)pcVar16);
                    if (pcVar18 == (char *)0x0) {
                      iVar5 = (int)pcVar8 - (int)pcVar14;
                      uVar13 = 0;
                      uVar11 = iVar5 - (uint)(pcVar14[iVar5 - 1] == '\r');
                    }
                    else {
                      uVar11 = (int)pcVar18 - (int)pcVar14;
                    }
                    if (pcVar14[uVar11 - 1] == '\"') {
                      uVar11 = uVar11 - 1;
                    }
                    uVar23 = (ulong)uVar11;
                    local_98 = pcVar14;
                  }
                  else if ((pcVar16 + 9 < pcVar8) &&
                          (iVar5 = strncasecmp(pcVar16,"filename",8), iVar5 == 0)) {
                    cVar20 = pcVar16[8];
                    pcVar18 = pcVar16 + 8;
                    if (cVar20 == '*') {
                      pcVar18 = pcVar16 + 9;
                    }
                    iVar5 = 6;
                    pcVar8 = pcVar19;
                    uVar17 = local_90;
                    if (pcVar16[(ulong)(cVar20 == '*') + 8] == '=') {
                      uVar13 = (ulong)(pcVar18[1] == ' ');
                      pcVar8 = pcVar18 + 1;
                      if (pcVar18[1] == ' ') {
                        pcVar8 = pcVar18 + 2;
                      }
                      pcVar8 = pcVar8 + (pcVar18[uVar13 + 1] == '\"');
                      sVar15 = (long)local_e8 - (long)pcVar8;
                      if ((pcVar19 == (char *)0x0) || (cVar20 == '*')) {
                        pcVar18 = (char *)memchr(pcVar8,0x3b,sVar15);
                        if (pcVar18 == (char *)0x0) {
                          uVar13 = 0;
                          uVar11 = (int)sVar15 - (uint)(pcVar8[(int)sVar15 - 1] == '\r');
                        }
                        else {
                          uVar11 = (int)pcVar18 - (int)pcVar8;
                        }
                        if (pcVar8[uVar11 - 1] == '\"') {
                          uVar11 = uVar11 - 1;
                        }
                        iVar5 = 0;
                        uVar17 = (ulong)uVar11;
                        if (cVar20 == '*') {
                          uVar9 = http_decode_url(pcVar8,pcVar8,(ulong)uVar11);
                          uVar17 = uVar9 & 0xffffffff;
                          if ((long)uVar9 < 1) {
                            uVar17 = (ulong)uVar11;
                          }
                        }
                      }
                      else {
                        pcVar18 = (char *)memchr(pcVar19,0x3b,sVar15);
                        iVar5 = 0xc;
                        pcVar8 = pcVar19;
                        uVar17 = local_90;
                      }
                    }
                    local_90 = uVar17;
                    pcVar19 = pcVar8;
                    sVar10 = local_d0;
                    if ((iVar5 != 0xc) &&
                       (pcVar8 = local_80, pcVar14 = local_a0, pcVar22 = local_f0, iVar5 != 0))
                    goto LAB_0014caaa;
                  }
                  else {
                    pcVar18 = (char *)memchr(pcVar16,0x3b,(long)pcVar8 - (long)pcVar16);
                  }
                }
              }
              local_58 = uVar23;
              pcVar18 = local_e8 + 1;
              cVar20 = (char)sVar10 + '\x01';
              sVar10 = CONCAT71((int7)(sVar10 >> 8),cVar20);
              pcVar22 = local_f0;
            } while (cVar20 != '\x06');
            iVar5 = 6;
            pcVar8 = local_80;
            pcVar14 = local_a0;
          }
          goto LAB_0014caaa;
        }
        goto switchD_0014cacc_caseD_2;
      }
    }
    goto LAB_0014cafc;
  }
  uVar13 = h->body;
  if (uVar13 == 0) {
LAB_0014cce9:
    local_148.data = anon_var_dwarf_20f;
    uVar11 = 4;
    goto LAB_0014ccfc;
  }
  if ((uVar13 & 1) != 0) {
    fio_ltocstr(&local_148,(long)uVar13 >> 1);
    goto LAB_0014cda0;
  }
  uVar11 = (uint)uVar13 & 6;
  cVar20 = '(';
  switch(uVar11) {
  case 0:
switchD_0014cbd7_caseD_0:
    cVar20 = *(char *)(uVar13 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0014cbd7_caseD_4:
    cVar20 = '*';
    break;
  case 6:
    if ((char)uVar13 == '&') {
      local_148.data = anon_var_dwarf_21a;
      uVar11 = 5;
    }
    else {
      uVar3 = (uint)uVar13 & 0xff;
      if (uVar3 != 0x16) {
        if (uVar3 == 6) goto LAB_0014cce9;
        switch(uVar11) {
        case 0:
          goto switchD_0014cbd7_caseD_0;
        case 4:
          goto switchD_0014cbd7_caseD_4;
        case 6:
          cVar20 = (char)uVar13;
        }
        break;
      }
      local_148.data = anon_var_dwarf_225;
      uVar11 = 4;
    }
LAB_0014ccfc:
    local_148.capa = 0;
    local_148.len = (size_t)uVar11;
    goto LAB_0014cda0;
  }
  switch(cVar20) {
  case '\'':
    pfVar12 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar12 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar12 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar12 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar12 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar12 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar12->to_str)(&local_148,uVar13);
LAB_0014cda0:
  local_c8.data = local_148.data;
  local_c8.capa = local_148.capa;
  local_c8.len = local_148.len;
  if (h->params == 0) {
    pobj = &h->params;
    sVar10 = fiobj_json2obj(pobj,local_148.data,local_148.len);
    if (sVar10 != 0) {
      FVar6 = *pobj;
      iVar5 = 0;
      if (((uint)FVar6 & 7) != 4) {
        key = fiobj_str_new("JSON",4);
        hash = fiobj_hash_new2(4);
        *pobj = hash;
        fiobj_hash_set(hash,key,FVar6);
        fiobj_free(key);
      }
    }
  }
  return iVar5;
  while (pvVar7 = memchr(pcVar19,10,(size_t)(pcVar22 + -(long)pcVar19)), pvVar7 != (void *)0x0) {
LAB_0014c863:
    pcVar19 = (char *)((long)pvVar7 + 1);
    if ((pcVar22 + -(long)pcVar19 < local_50) ||
       (((*pcVar19 == '-' && (*(char *)((long)pvVar7 + 2) == '-')) &&
        (iVar5 = bcmp((void *)((long)pvVar7 + 3),local_60,(size_t)pcVar8), iVar5 == 0))))
    goto LAB_0014c944;
  }
  pcVar19 = (char *)0x0;
LAB_0014c944:
  if ((pcVar19 == (char *)0x0) || (pcVar22 <= pcVar19 + (long)pcVar8 + 4)) {
    if (local_124 == 0) {
      iVar5 = 2;
      local_124 = 0;
      pcVar14 = local_a0;
      goto LAB_0014caaa;
    }
    uVar9 = local_58 & 0xffffffff;
    local_150 = fiobj_str_new(local_98,uVar9);
    iVar5 = 3;
    local_124 = 1;
    local_68 = CONCAT71((int7)(uVar13 >> 8),1);
    if (local_e8 == (char *)0x0) {
      local_e0 = (char *)0x0;
      local_120 = (char *)0x0;
      goto LAB_0014caaa;
    }
    fiobj_str_write(local_150,"[type]",6);
    cVar20 = (char)local_150;
    uVar11 = (uint)local_150;
    if (local_150 == 0) {
      local_148.data = anon_var_dwarf_20f;
      uVar3 = 4;
LAB_0014bcc9:
      local_148.capa = 0;
      local_148.len = (size_t)uVar3;
    }
    else if ((local_150 & 1) == 0) {
      cVar2 = '(';
      switch(uVar11 & 6) {
      case 0:
switchD_0014ca83_caseD_0:
        cVar2 = *(char *)(local_150 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_0014ca83_caseD_4:
        cVar2 = '*';
        break;
      case 6:
        if (cVar20 == '&') {
          local_148.data = anon_var_dwarf_21a;
          uVar3 = 5;
          goto LAB_0014bcc9;
        }
        if ((uVar11 & 0xff) == 0x16) {
          local_148.data = anon_var_dwarf_225;
        }
        else {
          if ((uVar11 & 0xff) != 6) {
            switch(uVar11 & 6) {
            case 0:
              goto switchD_0014ca83_caseD_0;
            case 4:
              goto switchD_0014ca83_caseD_4;
            case 6:
              cVar2 = cVar20;
            }
            break;
          }
          local_148.data = anon_var_dwarf_20f;
        }
        local_148.capa = 0;
        local_148.len = 4;
        goto LAB_0014c101;
      }
      pfVar12 = &FIOBJECT_VTABLE_NUMBER;
      switch(cVar2) {
      case '\'':
        pfVar12 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar12 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar12 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar12 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar12 = &FIOBJECT_VTABLE_DATA;
      }
      (*pfVar12->to_str)(&local_148,local_150);
    }
    else {
      fio_ltocstr(&local_148,(long)local_150 >> 1);
    }
LAB_0014c101:
    http_add2hash(local_f8->params,local_148.data,local_148.len,local_78,local_a8 & 0xffffffff,'\0')
    ;
    fiobj_str_resize(local_150,uVar9);
    fiobj_str_write(local_150,"[name]",6);
    if (local_150 == 0) {
      local_118.data = anon_var_dwarf_20f;
      uVar11 = 4;
LAB_0014c191:
      local_118.capa = 0;
      local_118.len = (size_t)uVar11;
    }
    else if ((local_150 & 1) == 0) {
      cVar2 = '(';
      switch(uVar11 & 6) {
      case 0:
switchD_0014c16c_caseD_0:
        cVar2 = *(char *)(local_150 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_0014c16c_caseD_4:
        cVar2 = '*';
        break;
      case 6:
        if (cVar20 == '&') {
          local_118.data = anon_var_dwarf_21a;
          uVar11 = 5;
          goto LAB_0014c191;
        }
        if ((uVar11 & 0xff) == 0x16) {
          local_118.data = anon_var_dwarf_225;
        }
        else {
          if ((uVar11 & 0xff) != 6) {
            switch(uVar11 & 6) {
            case 0:
              goto switchD_0014c16c_caseD_0;
            case 4:
              goto switchD_0014c16c_caseD_4;
            case 6:
              cVar2 = cVar20;
            }
            break;
          }
          local_118.data = anon_var_dwarf_20f;
        }
        local_118.capa = 0;
        local_118.len = 4;
        goto LAB_0014c29f;
      }
      pfVar12 = &FIOBJECT_VTABLE_NUMBER;
      switch(cVar2) {
      case '\'':
        pfVar12 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar12 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar12 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar12 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar12 = &FIOBJECT_VTABLE_DATA;
      }
      (*pfVar12->to_str)(&local_118,local_150);
    }
    else {
      fio_ltocstr(&local_118,(long)local_150 >> 1);
    }
LAB_0014c29f:
    local_148.data = local_118.data;
    local_148.capa = local_118.capa;
    local_148.len = local_118.len;
    http_add2hash(local_f8->params,local_118.data,local_118.len,local_e8,uVar17 & 0xffffffff,'\0');
    fiobj_str_resize(local_150,uVar9);
    fiobj_str_write(local_150,"[data]",6);
    local_e0 = (char *)0x0;
    local_120 = (char *)0x0;
    pcVar22 = local_f0;
    goto LAB_0014caaa;
  }
  pcVar16 = pcVar19 + ~(ulong)pcVar14;
  uVar11 = (uint)pcVar16;
  if (pcVar14[(ulong)(pcVar16 + 0xffffffff) & 0xffffffff] == '\r') {
    uVar11 = (uint)(pcVar16 + 0xffffffff);
  }
  uVar13 = local_58 & 0xffffffff;
  if ((int)uVar17 == 0) {
    local_124 = 0;
    http_add2hash(local_f8->params,local_98,uVar13,pcVar14,(ulong)uVar11,'\0');
    iVar5 = 0;
    pcVar14 = pcVar19;
    goto LAB_0014caaa;
  }
  local_d0 = uVar13;
  FVar6 = fiobj_str_new(local_98,uVar13);
  fiobj_str_write(FVar6,"[data]",6);
  cVar20 = (char)FVar6;
  uVar3 = (uint)FVar6;
  i = (long)FVar6 >> 1;
  if (FVar6 == 0) {
LAB_0014bd04:
    local_148.data = anon_var_dwarf_20f;
    uVar24 = 4;
    goto LAB_0014bd17;
  }
  if ((FVar6 & 1) == 0) {
    cVar2 = '(';
    switch(uVar3 & 6) {
    case 0:
switchD_0014c9e8_caseD_0:
      cVar2 = *(char *)(FVar6 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0014c9e8_caseD_4:
      cVar2 = '*';
      break;
    case 6:
      if (cVar20 == '&') {
        local_148.data = anon_var_dwarf_21a;
        uVar24 = 5;
      }
      else {
        if ((uVar3 & 0xff) != 0x16) {
          if ((uVar3 & 0xff) == 6) goto LAB_0014bd04;
          switch(uVar3 & 6) {
          case 0:
            goto switchD_0014c9e8_caseD_0;
          case 4:
            goto switchD_0014c9e8_caseD_4;
          case 6:
            cVar2 = cVar20;
          }
          break;
        }
        local_148.data = anon_var_dwarf_225;
        uVar24 = 4;
      }
LAB_0014bd17:
      local_148.capa = 0;
      local_148.len = (size_t)uVar24;
      goto LAB_0014bdf2;
    }
    pfVar12 = &FIOBJECT_VTABLE_NUMBER;
    switch(cVar2) {
    case '\'':
      pfVar12 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar12 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar12 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar12 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar12 = &FIOBJECT_VTABLE_DATA;
    }
    (*pfVar12->to_str)(&local_148,FVar6);
  }
  else {
    fio_ltocstr(&local_148,i);
  }
LAB_0014bdf2:
  http_add2hash(local_f8->params,local_148.data,local_148.len,pcVar14,(ulong)uVar11,'\0');
  fiobj_str_resize(FVar6,local_d0);
  fiobj_str_write(FVar6,"[name]",6);
  uVar13 = local_a8;
  phVar21 = local_f8;
  if (FVar6 == 0) {
    local_118.data = anon_var_dwarf_20f;
    local_118.capa = 0;
    local_118.len = 4;
  }
  else if ((FVar6 & 1) == 0) {
    cVar2 = '(';
    switch(uVar3 & 6) {
    case 0:
switchD_0014be65_caseD_0:
      cVar2 = *(char *)(FVar6 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0014be65_caseD_4:
      cVar2 = '*';
      break;
    case 6:
      if (cVar20 == '&') {
        local_118.data = anon_var_dwarf_21a;
        uVar11 = 5;
      }
      else if ((uVar3 & 0xff) == 0x16) {
        local_118.data = anon_var_dwarf_225;
        uVar11 = 4;
      }
      else {
        if ((uVar3 & 0xff) != 6) {
          switch(uVar3 & 6) {
          case 0:
            goto switchD_0014be65_caseD_0;
          case 4:
            goto switchD_0014be65_caseD_4;
          case 6:
            cVar2 = cVar20;
          }
          break;
        }
        local_118.data = anon_var_dwarf_20f;
        uVar11 = 4;
      }
      local_118.capa = 0;
      local_118.len = (size_t)uVar11;
      goto LAB_0014bf7b;
    }
    pfVar12 = &FIOBJECT_VTABLE_NUMBER;
    switch(cVar2) {
    case '\'':
      pfVar12 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar12 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar12 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar12 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar12 = &FIOBJECT_VTABLE_DATA;
    }
    (*pfVar12->to_str)(&local_118,FVar6);
  }
  else {
    fio_ltocstr(&local_118,i);
    phVar21 = local_f8;
  }
LAB_0014bf7b:
  local_148.data = local_118.data;
  local_148.capa = local_118.capa;
  local_148.len = local_118.len;
  http_add2hash(phVar21->params,local_118.data,local_118.len,local_e8,uVar17 & 0xffffffff,'\0');
  if ((int)uVar13 != 0) {
    fiobj_str_resize(FVar6,local_d0);
    fiobj_str_write(FVar6,"[type]",6);
    if (FVar6 == 0) {
LAB_0014c03b:
      local_118.data = anon_var_dwarf_20f;
      uVar11 = 4;
      goto LAB_0014c04e;
    }
    if ((FVar6 & 1) == 0) {
      cVar2 = '(';
      switch(uVar3 & 6) {
      case 0:
switchD_0014bff6_caseD_0:
        cVar2 = *(char *)(FVar6 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_0014bff6_caseD_4:
        cVar2 = '*';
        break;
      case 6:
        if (cVar20 == '&') {
          local_118.data = anon_var_dwarf_21a;
          uVar11 = 5;
        }
        else {
          if ((uVar3 & 0xff) != 0x16) {
            if ((uVar3 & 0xff) == 6) goto LAB_0014c03b;
            switch(uVar3 & 6) {
            case 0:
              goto switchD_0014bff6_caseD_0;
            case 4:
              goto switchD_0014bff6_caseD_4;
            case 6:
              cVar2 = cVar20;
            }
            break;
          }
          local_118.data = anon_var_dwarf_225;
          uVar11 = 4;
        }
LAB_0014c04e:
        local_118.capa = 0;
        local_118.len = (size_t)uVar11;
        goto LAB_0014c389;
      }
      pfVar12 = &FIOBJECT_VTABLE_NUMBER;
      switch(cVar2) {
      case '\'':
        pfVar12 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar12 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar12 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar12 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar12 = &FIOBJECT_VTABLE_DATA;
      }
      (*pfVar12->to_str)(&local_118,FVar6);
    }
    else {
      fio_ltocstr(&local_118,i);
    }
LAB_0014c389:
    local_148.data = local_118.data;
    local_148.capa = local_118.capa;
    local_148.len = local_118.len;
    http_add2hash(phVar21->params,local_118.data,local_118.len,local_78,uVar13 & 0xffffffff,'\0');
  }
  fiobj_free(FVar6);
  local_124 = 0;
  iVar5 = 0;
  pcVar14 = pcVar19;
  pcVar22 = local_f0;
LAB_0014caaa:
  if (iVar5 != 0) goto code_r0x0014cab2;
  goto LAB_0014c3ff;
code_r0x0014cab2:
  if (iVar5 - 2U < 8) {
    pcVar19 = (char *)((long)&switchD_0014cacc::switchdataD_00168ef8 +
                      (long)(int)(&switchD_0014cacc::switchdataD_00168ef8)[iVar5 - 2U]);
    switch(iVar5) {
    case 2:
      goto switchD_0014cacc_caseD_2;
    case 3:
      goto LAB_0014b8e3;
    case 6:
switchD_0014cacc_caseD_6:
      pcVar14 = pcVar14 + -(long)local_88;
      local_d8 = (undefined4)CONCAT71((int7)((ulong)pcVar19 >> 8),1);
      local_d4 = 0;
      break;
    case 9:
      pcVar14 = pcVar14 + -(long)local_88;
      local_d4 = (undefined4)
                 CONCAT71((int7)((ulong)((long)&switchD_0014cacc::switchdataD_00168ef8 +
                                        (long)(int)(&switchD_0014cacc::switchdataD_00168ef8)
                                                   [iVar5 - 2U]) >> 8),1);
      local_d8 = 0;
    }
  }
  pcVar16 = local_120;
  goto LAB_0014cb4d;
switchD_0014cacc_caseD_2:
  pcVar16 = local_120;
LAB_0014cafc:
  pcVar14 = pcVar14 + -(long)local_88;
LAB_0014cb4d:
  pcVar18 = local_38 + (long)pcVar14;
  fiobj_data_pread(&local_148,local_f8->body,(intptr_t)pcVar18,0x1000);
  if (((local_148.data == (char *)0x0) || ((char)local_d4 != '\0')) ||
     (pcVar19 = (char *)local_148.len, pcVar14 = local_148.data, (char)local_d8 != '\0')) {
    fiobj_free(local_150);
    return 0;
  }
  goto LAB_0014b8a1;
}

Assistant:

int http_parse_body(http_s *h) {
  static uint64_t content_type_hash;
  if (!h->body)
    return -1;
  if (!content_type_hash)
    content_type_hash = fiobj_hash_string("content-type", 12);
  FIOBJ ct = fiobj_hash_get2(h->headers, content_type_hash);
  fio_str_info_s content_type = fiobj_obj2cstr(ct);
  if (content_type.len < 16)
    return -1;
  if (content_type.len >= 33 &&
      !strncasecmp("application/x-www-form-urlencoded", content_type.data,
                   33)) {
    if (!h->params)
      h->params = fiobj_hash_new();
    FIOBJ tmp = h->query;
    h->query = h->body;
    http_parse_query(h);
    h->query = tmp;
    return 0;
  }
  if (content_type.len >= 16 &&
      !strncasecmp("application/json", content_type.data, 16)) {
    content_type = fiobj_obj2cstr(h->body);
    if (h->params)
      return -1;
    if (fiobj_json2obj(&h->params, content_type.data, content_type.len) == 0)
      return -1;
    if (FIOBJ_TYPE_IS(h->params, FIOBJ_T_HASH))
      return 0;
    FIOBJ tmp = h->params;
    FIOBJ key = fiobj_str_new("JSON", 4);
    h->params = fiobj_hash_new2(4);
    fiobj_hash_set(h->params, key, tmp);
    fiobj_free(key);
    return 0;
  }

  http_fio_mime_s p = {.h = h};
  if (http_mime_parser_init(&p.p, content_type.data, content_type.len))
    return -1;
  if (!h->params)
    h->params = fiobj_hash_new();

  do {
    size_t cons = http_mime_parse(&p.p, p.buffer.data, p.buffer.len);
    p.pos += cons;
    p.buffer = fiobj_data_pread(h->body, p.pos, 4096);
  } while (p.buffer.data && !p.p.done && !p.p.error);
  fiobj_free(p.partial_name);
  p.partial_name = FIOBJ_INVALID;
  return 0;
}